

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O3

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertWithExpressions<mp::LinTerms,mp::AlgConRhs<1>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *con,int i,
          ConstraintAcceptanceLevel cal,ExpressionAcceptanceLevel param_4)

{
  size_ty sVar1;
  ptr piVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  alscope;
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  local_40;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *local_38;
  
  if (*(int *)(this + 0x40) != 1) {
    return false;
  }
  if (cal == Recommended) {
    sVar1 = (con->super_LinTerms).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    if (sVar1 == 0) {
      return false;
    }
    piVar2 = (con->super_LinTerms).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    lVar7 = 0;
    local_38 = con;
    do {
      bVar3 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                        ((FlatModel<mp::DefaultFlatModelParams> *)(this + -0x208),
                         *(int *)((long)piVar2 + lVar7));
      if (!bVar3) break;
      bVar8 = sVar1 * 4 + -4 != lVar7;
      lVar7 = lVar7 + 4;
    } while (bVar8);
    con = local_38;
    if (bVar3) {
      return false;
    }
  }
  local_40.cvt_ =
       (FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        *)(this + -0x208);
  uVar5 = i >> 0x1f & *(uint *)(this + 0xe18);
  iVar4 = uVar5 + i + 1;
  iVar6 = uVar5 + i;
  if ((int)*(uint *)(this + 0xe18) <= iVar6) {
    *(long *)(this + 0xe18) = (long)iVar4;
  }
  *(Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    **)(this + 0x840) = this + 0xdc8;
  *(ulong *)(this + 0x848) = CONCAT44(iVar4,iVar6);
  bVar3 = Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          ::HasLogicalExpressionArgs
                    ((Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                      *)this,&con->super_LinTerms);
  if (bVar3) {
    bVar3 = HandleLogicalArgs<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>(this,con,i);
    bVar8 = true;
    if (bVar3) goto LAB_003135ba;
  }
  bVar8 = ConvertToNLCon<mp::LinTerms,mp::AlgConRhs<1>>(this,con,i);
LAB_003135ba:
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~AutoLinkScope(&local_40);
  return bVar8;
}

Assistant:

bool ConvertWithExpressions(
      const AlgebraicConstraint<Body, RhsOrRange>& con,
      int i,
      ConstraintAcceptanceLevel cal, ExpressionAcceptanceLevel ) {
    assert(stage_cvt2expr_>0);
    /// Replace \a con by a NLConstraint,
    /// if either the ModelAPI does not accept it,
    /// or the linear/quadratic terms have expressions
    /// (and then they are non-flat.)
    if (1==stage_cvt2expr_
        && (ConstraintAcceptanceLevel::Recommended != cal
            || HasExpressionArgs(con.GetBody()))) {
      auto alscope = MPD( MakeAutoLinker( con, i ) );   // link from \a con
      if (HasLogicalExpressionArgs(con.GetBody()))
        if (HandleLogicalArgs(con, i))
          return true;                     // to remove the original \a con
      return ConvertToNLCon(con, i);       // convert if expr's, or not acc
    }
    return false;
  }